

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitBlock(FunctionValidator *this,Block *curr)

{
  bool bVar1;
  Module *pMVar2;
  pointer ppVar3;
  reference pTVar4;
  Function *pFVar5;
  Type breakType;
  iterator __end2;
  iterator __begin2;
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  *__range2;
  _Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
  local_30;
  iterator iter;
  Block *curr_local;
  FunctionValidator *this_local;
  
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasMultivalue(&pMVar2->features);
  if (!bVar1) {
    bVar1 = wasm::Type::isTuple(&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).
                                 super_Expression.type);
    shouldBeTrue<wasm::Block*>
              (this,(bool)((bVar1 ^ 0xffU) & 1),curr,
               "Multivalue block type require multivalue [--enable-multivalue]");
  }
  bVar1 = IString::is(&(curr->name).super_IString);
  if (bVar1) {
    iter.
    super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
               )(curr->name).super_IString.str._M_len;
    noteLabelName(this,(Name)(curr->name).super_IString.str);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
         ::find(&this->breakTypes,&curr->name);
    __range2 = (unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                *)std::
                  unordered_map<wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
                  ::end(&this->breakTypes);
    bVar1 = std::__detail::operator!=
                      (&local_30,
                       (_Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
                        *)&__range2);
    if (!bVar1) {
      __assert_fail("iter != breakTypes.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                    ,0x278,"void wasm::FunctionValidator::visitBlock(Block *)");
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_false,_true>
                           *)&local_30);
    __end2 = std::
             unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
             ::begin(&ppVar3->second);
    breakType.id = (uintptr_t)
                   std::
                   unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                   ::end(&ppVar3->second);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<wasm::Type,_true>,
                              (_Node_iterator_base<wasm::Type,_true> *)&breakType), bVar1) {
      pTVar4 = std::__detail::_Node_iterator<wasm::Type,_true,_true>::operator*(&__end2);
      shouldBeSubType(this,(Type)pTVar4->id,
                      (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)1>).
                            super_Expression.type.id,(Expression *)curr,
                      "break type must be a subtype of the target block type");
      std::__detail::_Node_iterator<wasm::Type,_true,_true>::operator++(&__end2);
    }
    std::
    unordered_map<wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
    ::erase(&this->breakTypes,(iterator)local_30._M_cur);
  }
  pFVar5 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
           getFunction(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
  if (pFVar5->profile == Normal) {
    validateNormalBlockElements(this,curr);
  }
  else if (pFVar5->profile == Poppy) {
    validatePoppyBlockElements(this,curr);
  }
  return;
}

Assistant:

void FunctionValidator::visitBlock(Block* curr) {
  if (!getModule()->features.hasMultivalue()) {
    shouldBeTrue(
      !curr->type.isTuple(),
      curr,
      "Multivalue block type require multivalue [--enable-multivalue]");
  }
  // if we are break'ed to, then the value must be right for us
  if (curr->name.is()) {
    noteLabelName(curr->name);
    auto iter = breakTypes.find(curr->name);
    assert(iter != breakTypes.end()); // we set it ourselves
    for (Type breakType : iter->second) {
      // none or unreachable means a poison value that we should ignore - if
      // consumed, it will error
      shouldBeSubType(breakType,
                      curr->type,
                      curr,
                      "break type must be a subtype of the target block type");
    }
    breakTypes.erase(iter);
  }
  switch (getFunction()->profile) {
    case IRProfile::Normal:
      validateNormalBlockElements(curr);
      break;
    case IRProfile::Poppy:
      validatePoppyBlockElements(curr);
      break;
  }
}